

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::trackerid_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,trackerid_alert *this)

{
  char *__rhs;
  allocator<char> local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"trackerid received: ",&local_31);
  __rhs = tracker_id(this);
  std::operator+(__return_storage_ptr__,&local_30,__rhs);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string trackerid_alert::message() const
	{
		return std::string("trackerid received: ") + tracker_id();
	}